

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  char *buf_ptr;
  char *buf_ptr_00;
  long lVar1;
  char *pcVar2;
  char *extraout_RDX;
  char *ptr;
  char *extraout_RDX_00;
  char *pcVar3;
  long lVar4;
  char buf [7];
  anon_class_8_1_54a39806 decode;
  char local_38 [8];
  anon_class_8_1_54a39806 local_30;
  
  pcVar2 = (char *)s.size_;
  pcVar3 = s.data_;
  buf_ptr_00 = local_38;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>.grow_ =
       basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_>::grow;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  buf_ptr = pcVar3;
  ptr = pcVar2;
  local_30.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if (pcVar2 < (char *)0x4) {
LAB_00471010:
    lVar4 = (long)(pcVar3 + (long)pcVar2) - (long)buf_ptr;
    if (lVar4 != 0) {
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[0] = '\0';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      for (lVar1 = 0; lVar4 != lVar1; lVar1 = lVar1 + 1) {
        ptr = (char *)CONCAT71((int7)((ulong)ptr >> 8),buf_ptr[lVar1]);
        local_38[lVar1] = buf_ptr[lVar1];
      }
      do {
        buf_ptr_00 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/build_O2/_deps/fmt-src/include/fmt/format-inl.h:1412:25)>
                     ::anon_class_8_1_54a39806::operator()(&local_30,buf_ptr_00,ptr);
        if (buf_ptr_00 == (char *)0x0) break;
        ptr = extraout_RDX_00;
      } while (buf_ptr_00 < local_38 + lVar4);
    }
  }
  else {
    do {
      if (pcVar3 + (long)pcVar2 + -3 <= buf_ptr) goto LAB_00471010;
      buf_ptr = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/build_O2/_deps/fmt-src/include/fmt/format-inl.h:1412:25)>
                ::anon_class_8_1_54a39806::operator()(&local_30,buf_ptr,ptr);
      ptr = extraout_RDX;
    } while (buf_ptr != (char *)0x0);
  }
  local_30.f.this = (anon_class_8_1_8991fb9c_for_f)((ulong)local_30.f.this & 0xffffffff00000000);
  buffer<wchar_t>::push_back((buffer<wchar_t> *)this,(wchar_t *)&local_30);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}